

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTableCell::isSelected(QAccessibleTableCell *this)

{
  byte bVar1;
  ulong uVar2;
  QItemSelectionModel *pQVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  bool local_21;
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar2 & 1) == 0) {
    local_21 = false;
  }
  else {
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9184);
    pQVar3 = QAbstractItemView::selectionModel(in_stack_ffffffffffffffc0);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
    bVar1 = QItemSelectionModel::isSelected((QModelIndex *)pQVar3);
    local_21 = (bool)(bVar1 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTableCell::isSelected() const
{
    if (!isValid())
        return false;
    return view->selectionModel()->isSelected(m_index);
}